

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O1

int __thiscall IDisk::CreateUnformattedTrack(IDisk *this,int side,int track)

{
  MFMTrack *pMVar1;
  int i;
  uchar *puVar2;
  long lVar3;
  
  pMVar1 = this->side_[side].tracks;
  pMVar1[track].size = 100000;
  puVar2 = (uchar *)operator_new__(0x186c0);
  pMVar1[track].bitfield = puVar2;
  lVar3 = 0;
  do {
    this->side_[side].tracks[track].bitfield[lVar3] = '\x04';
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100000);
  return 100000;
}

Assistant:

int IDisk::CreateUnformattedTrack(int side, int track)
{
   // todo
   int size = 100000;
   if (size != 0)
   {
      side_[side].tracks[track].size = size;
      side_[side].tracks[track].bitfield = new unsigned char[side_[side].tracks[track].size + 32];

      for (int i = 0; i < size; i++)
      {
         side_[side].tracks[track].bitfield[i] = BIT_WEAK;
      }
   }

   return size;
}